

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_audio.cpp
# Opt level: O2

void __thiscall cubeb_run_channel_rate_test_Test::TestBody(cubeb_run_channel_rate_test_Test *this)

{
  uint num_channels;
  long lVar1;
  int iVar2;
  String *this_00;
  char *message;
  AssertionResult gtest_ar_;
  AssertHelper local_60;
  String local_58;
  long local_48;
  long local_40;
  AssertHelper local_38;
  
  local_48 = 0;
  do {
    if (local_48 == 0x14) {
      return;
    }
    num_channels = *(uint *)((long)&DAT_00136330 + local_48);
    lVar1 = 0;
    while (lVar1 != 0x10) {
      gtest_ar_.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      iVar2 = *(int *)((long)&DAT_00136040 + lVar1);
      gtest_ar_.success_ = num_channels < 0x20;
      if (0x1f < num_channels) {
        this_00 = (String *)&local_60;
        testing::Message::Message((Message *)this_00);
        testing::internal::GetBoolAssertionFailureMessage
                  ((internal *)&local_58,&gtest_ar_,"channels < MAX_NUM_CHANNELS","false","true");
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/test/test_audio.cpp"
                   ,0xee,(char *)CONCAT44(local_58.c_str_._4_4_,(int)local_58.c_str_));
        testing::internal::AssertHelper::operator=(&local_38,(Message *)this_00);
        testing::internal::AssertHelper::~AssertHelper(&local_38);
        testing::internal::String::~String(&local_58);
        goto LAB_0011c9f3;
      }
      local_40 = lVar1;
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_.message_);
      fwrite("--------------------------\n",0x1b,1,_stderr);
      local_58.c_str_._0_4_ = run_test(num_channels,iVar2,0);
      local_60.data_._0_4_ = 0;
      testing::internal::EqHelper<false>::Compare<int,__0>
                (&gtest_ar_.success_,"run_test(channels, freq, 0)",(int *)&local_58,
                 (anon_enum_32 *)&local_60);
      if (gtest_ar_.success_ == false) {
        testing::Message::Message((Message *)&local_58);
        if (gtest_ar_.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = "";
        }
        else {
          message = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
        }
        iVar2 = 0xf0;
LAB_0011ca81:
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/test/test_audio.cpp"
                   ,iVar2,message);
        this_00 = &local_58;
        testing::internal::AssertHelper::operator=(&local_60,(Message *)this_00);
        testing::internal::AssertHelper::~AssertHelper(&local_60);
LAB_0011c9f3:
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)this_00);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_.message_);
        return;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_.message_);
      local_58.c_str_._0_4_ = run_test(num_channels,iVar2,1);
      local_60.data_._0_4_ = 0;
      testing::internal::EqHelper<false>::Compare<int,__0>
                (&gtest_ar_.success_,"run_test(channels, freq, 1)",(int *)&local_58,
                 (anon_enum_32 *)&local_60);
      if (gtest_ar_.success_ == false) {
        testing::Message::Message((Message *)&local_58);
        if (gtest_ar_.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = "";
        }
        else {
          message = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
        }
        iVar2 = 0xf1;
        goto LAB_0011ca81;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_.message_);
      lVar1 = local_40 + 4;
    }
    local_48 = local_48 + 4;
  } while( true );
}

Assistant:

TEST(cubeb, run_channel_rate_test)
{
  unsigned int channel_values[] = {
    1,
    2,
    3,
    4,
    6,
  };

  int freq_values[] = {
    16000,
    24000,
    44100,
    48000,
  };

  for(auto channels : channel_values) {
    for(auto freq : freq_values) {
      ASSERT_TRUE(channels < MAX_NUM_CHANNELS);
      fprintf(stderr, "--------------------------\n");
      ASSERT_EQ(run_test(channels, freq, 0), CUBEB_OK);
      ASSERT_EQ(run_test(channels, freq, 1), CUBEB_OK);
    }
  }
}